

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O3

void __thiscall despot::BaseRockSample::PrintAction(BaseRockSample *this)

{
  ostream *in_RDX;
  int in_ESI;
  
  if (in_ESI < 4) {
    in_RDX = std::__ostream_insert<char,std::char_traits<char>>
                       (in_RDX,(char *)(&Compass::CompassString_abi_cxx11_)[(long)in_ESI * 4],
                        *(long *)(std::__cxx11::string::replace + (long)in_ESI * 0x20));
  }
  else if (in_ESI == 4) {
    std::__ostream_insert<char,std::char_traits<char>>(in_RDX,"Sample",6);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(in_RDX,"Check ",6);
    in_RDX = (ostream *)std::ostream::operator<<((ostream *)in_RDX,in_ESI + -5);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)in_RDX + -0x18) + (char)in_RDX);
  std::ostream::put((char)in_RDX);
  std::ostream::flush();
  return;
}

Assistant:

void BaseRockSample::PrintAction(ACT_TYPE action, ostream& out) const {
	if (action < E_SAMPLE)
		out << Compass::CompassString[action] << endl;
	if (action == E_SAMPLE)
		out << "Sample" << endl;
	if (action > E_SAMPLE)
		out << "Check " << (action - E_SAMPLE - 1) << endl;
}